

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O0

void duckdb_je_pa_shard_reset(tsdn_t *tsdn,pa_shard_t *shard)

{
  tsdn_t *tsdn_00;
  long in_RSI;
  uint in_stack_ffffffffffffffb8;
  
  tsdn_00 = (tsdn_t *)(in_RSI + 8);
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled = false;
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level = '\0';
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_min_init_state_nfetched =
       '\0';
  *(undefined5 *)&(tsdn_00->tsd).field_0x3 = 0;
  if ((*(byte *)(in_RSI + 0x11) & 1) != 0) {
    duckdb_je_sec_flush(tsdn_00,(sec_t *)(ulong)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void
pa_shard_reset(tsdn_t *tsdn, pa_shard_t *shard) {
	atomic_store_zu(&shard->nactive, 0, ATOMIC_RELAXED);
	if (shard->ever_used_hpa) {
		sec_flush(tsdn, &shard->hpa_sec);
	}
}